

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.cpp
# Opt level: O3

CallFunc * __thiscall ThreadPool::Take(CallFunc *__return_storage_ptr__,ThreadPool *this)

{
  bool bVar1;
  function<void_()> *__x;
  LockGuard lock;
  LockGuard local_20;
  
  LockGuard::LockGuard(&local_20,&this->m_mutex);
  do {
    __x = (this->m_tasks).
          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
          _M_impl.super__Deque_impl_data._M_start._M_cur;
    bVar1 = this->m_bRunning;
    if ((this->m_tasks).
        super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur != __x) {
      (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
      __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
      *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
      if ((bVar1 & 1U) != 0) {
        std::function<void_()>::operator=(__return_storage_ptr__,__x);
        std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::pop_front
                  (&this->m_tasks);
        Condition::Notify(&this->m_notFull);
      }
LAB_00103c30:
      LockGuard::~LockGuard(&local_20);
      return __return_storage_ptr__;
    }
    if ((bVar1 & 1U) == 0) {
      (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
      __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
      *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
      goto LAB_00103c30;
    }
    Condition::Wait(&this->m_notEmpty);
  } while( true );
}

Assistant:

ThreadPool::CallFunc ThreadPool::Take()
{
	LockGuard lock(m_mutex);
	while(m_tasks.empty() && m_bRunning)
	{
		m_notEmpty.Wait();
	}
	
	CallFunc retFunc;
	if (m_bRunning)
	{
		retFunc = m_tasks.front();
		m_tasks.pop_front();
		m_notFull.Notify();
	}
	
	return retFunc;
}